

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  string *psVar6;
  long lVar7;
  void **ppvVar8;
  
  sVar5 = (size_t)(this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar1 = sVar5 * 8;
  for (lVar7 = 0; lVar1 - lVar7 != 0; lVar7 = lVar7 + 8) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                      (*(ItemSimilarityRecommender_SimilarItems **)((long)ppvVar8 + lVar7));
    sVar5 = sVar5 + sVar4;
  }
  psVar6 = (string *)((ulong)(this->iteminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 1;
  }
  psVar6 = (string *)
           ((ulong)(this->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
           );
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 1;
  }
  psVar6 = (string *)
           ((ulong)(this->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 1;
  }
  psVar6 = (string *)
           ((ulong)(this->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 1;
  }
  psVar6 = (string *)
           ((ulong)(this->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 2;
  }
  psVar6 = (string *)
           ((ulong)(this->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ &
           0xfffffffffffffffe);
  if (psVar6->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sVar5 = sVar5 + sVar4 + 2;
  }
  if (this->itemstringids_ != (StringVector *)0x0 &&
      this != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::StringVector>(this->itemstringids_);
    sVar5 = sVar5 + sVar4 + 1;
  }
  if (this->itemint64ids_ != (Int64Vector *)0x0 &&
      this != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64Vector>(this->itemint64ids_);
    sVar5 = sVar5 + sVar4 + 1;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  total_size += 1UL * this->_internal_itemitemsimilarities_size();
  for (const auto& msg : this->itemitemsimilarities_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string itemInputFeatureName = 10;
  if (!this->_internal_iteminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (!this->_internal_numrecommendationsinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (!this->_internal_itemrestrictioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (!this->_internal_itemexclusioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (!this->_internal_recommendeditemlistoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (!this->_internal_recommendeditemscoreoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->_internal_has_itemstringids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->_internal_has_itemint64ids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemint64ids_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}